

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O0

void __thiscall ProtocolARP::SendReply(ProtocolARP *this,ARPInfo *info)

{
  uint8_t *puVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  uint8_t *value;
  DataBuffer *txBuffer;
  int offset;
  ARPInfo *info_local;
  ProtocolARP *this_local;
  undefined8 *puVar3;
  
  iVar2 = (*this->MAC->_vptr_InterfaceMAC[7])();
  puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
  if (puVar3 == (undefined8 *)0x0) {
    printf("ARP failed to get tx buffer\n");
  }
  else {
    sVar4 = Pack16((uint8_t *)*puVar3,0,info->hardwareType);
    sVar4 = Pack16((uint8_t *)*puVar3,(long)(int)sVar4,info->protocolType);
    sVar4 = Pack8((uint8_t *)*puVar3,(long)(int)sVar4,info->hardwareSize);
    sVar4 = Pack8((uint8_t *)*puVar3,(long)(int)sVar4,info->protocolSize);
    sVar4 = Pack16((uint8_t *)*puVar3,(long)(int)sVar4,2);
    puVar1 = (uint8_t *)*puVar3;
    iVar2 = (*this->MAC->_vptr_InterfaceMAC[5])();
    sVar4 = PackBytes(puVar1,(long)(int)sVar4,(uint8_t *)CONCAT44(extraout_var_00,iVar2),
                      (ulong)info->hardwareSize);
    puVar1 = (uint8_t *)*puVar3;
    value = ProtocolIPv4::GetUnicastAddress(this->IP);
    sVar4 = PackBytes(puVar1,(long)(int)sVar4,value,(ulong)info->protocolSize);
    sVar4 = PackBytes((uint8_t *)*puVar3,(long)(int)sVar4,info->senderHardwareAddress,
                      (ulong)info->hardwareSize);
    sVar4 = PackBytes((uint8_t *)*puVar3,(long)(int)sVar4,info->senderProtocolAddress,
                      (ulong)info->protocolSize);
    *(short *)(puVar3 + 2) = (short)sVar4;
    (*this->MAC->_vptr_InterfaceMAC[10])(this->MAC,puVar3,info->senderHardwareAddress,0x806);
  }
  return;
}

Assistant:

void ProtocolARP::SendReply(const ARPInfo& info)
{
    int offset = 0;
    DataBuffer* txBuffer = MAC.GetTxBuffer();
    if (txBuffer == nullptr)
    {
        printf("ARP failed to get tx buffer\n");
        return;
    }

    offset = Pack16(txBuffer->Packet, offset, info.hardwareType);
    offset = Pack16(txBuffer->Packet, offset, info.protocolType);
    offset = Pack8(txBuffer->Packet, offset, info.hardwareSize);
    offset = Pack8(txBuffer->Packet, offset, info.protocolSize);
    offset = Pack16(txBuffer->Packet, offset, 2); // ARP Reply
    offset = PackBytes(txBuffer->Packet, offset, MAC.GetUnicastAddress(), info.hardwareSize);
    offset = PackBytes(txBuffer->Packet, offset, IP.GetUnicastAddress(), info.protocolSize);
    offset = PackBytes(txBuffer->Packet, offset, info.senderHardwareAddress, info.hardwareSize);
    offset = PackBytes(txBuffer->Packet, offset, info.senderProtocolAddress, info.protocolSize);
    txBuffer->Length = offset;

    MAC.Transmit(txBuffer, info.senderHardwareAddress, 0x0806);
}